

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

void Corrade::Containers::
     ArrayNewAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::deleter(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,size_t size)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  size_t size_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data_local;
  
  for (end = data; end != data + size * 0x20; end = end + 0x20) {
    std::__cxx11::string::~string((string *)end);
  }
  deallocate(data);
  return;
}

Assistant:

static void deleter(T* data, std::size_t size) {
        for(T *it = data, *end = data + size; it != end; ++it) it->~T();
        deallocate(data);
    }